

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::ProgramBinaryPersistenceCase::test(ProgramBinaryPersistenceCase *this)

{
  TestLog *log;
  RenderContext *renderCtx;
  TestLog *log_00;
  Shader *this_00;
  Shader *this_01;
  char *__to;
  char *__from;
  Program program;
  ShaderAllocator shaders;
  ConstantShaderGenerator sourceGen;
  ProgramBinary binary;
  Program PStack_248;
  ShaderAllocator local_208;
  SourceGenerator local_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  pointer puStack_1a0;
  pointer local_198;
  ios_base local_138 [264];
  
  log = ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
        m_log;
  renderCtx = ((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx;
  local_208.m_srcGen = &local_1c8;
  local_1c8._vptr_SourceGenerator = (_func_int **)&PTR__ConstantShaderGenerator_02180cd8;
  local_1c0._0_4_ = (this->m_rnd).m_rnd.x;
  local_1c0._4_4_ = (this->m_rnd).m_rnd.y;
  uStack_1b8._0_4_ = (this->m_rnd).m_rnd.z;
  uStack_1b8._4_4_ = (this->m_rnd).m_rnd.w;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_208.m_context = renderCtx;
  local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_208.m_shaders._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  glu::Program::Program(&PStack_248,renderCtx);
  log_00 = ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)
           ->m_log;
  this_00 = Functional::anon_unknown_0::ShaderAllocator::createShader(&local_208,SHADERTYPE_VERTEX);
  this_01 = Functional::anon_unknown_0::ShaderAllocator::createShader
                      (&local_208,SHADERTYPE_FRAGMENT);
  glu::Shader::compile(this_00);
  glu::Shader::compile(this_01);
  glu::Program::attachShader(&PStack_248,this_00->m_shader);
  __from = (char *)(ulong)this_01->m_shader;
  glu::Program::attachShader(&PStack_248,this_01->m_shader);
  glu::Program::link(&PStack_248,__from,__to);
  Functional::anon_unknown_0::logProgram
            (log_00,((this->super_ProgramBinaryCase).super_TestCase.m_context)->m_renderCtx,
             &PStack_248,&local_208);
  if (PStack_248.m_info.linkOk == true) {
    local_1a8 = (_func_int **)0x0;
    puStack_1a0 = (pointer)0x0;
    local_198 = (pointer)0x0;
    ProgramBinaryCase::getProgramBinary
              (&this->super_ProgramBinaryCase,(ProgramBinary *)local_1b0,PStack_248.m_program);
    (*(this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[6]
    )(this,&PStack_248,&local_208);
    (*(this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7]
    )(this,&PStack_248,local_1b0);
    Functional::anon_unknown_0::logProgram(log,renderCtx,&PStack_248,&local_208);
    if (local_1a8 != (_func_int **)0x0) {
      operator_delete(local_1a8,(long)local_198 - (long)local_1a8);
    }
  }
  else {
    local_1b0 = (undefined1  [8])log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Fail, couldn\'t link program.",0x1c);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    tcu::TestContext::setTestResult
              ((this->super_ProgramBinaryCase).super_TestCase.super_TestCase.super_TestNode.
               m_testCtx,QP_TEST_RESULT_FAIL,"Linking failed");
  }
  glu::Program::~Program(&PStack_248);
  Functional::anon_unknown_0::ShaderAllocator::~ShaderAllocator(&local_208);
  return;
}

Assistant:

void ProgramBinaryPersistenceCase::test (void)
{
	TestLog&				log			= m_testCtx.getLog();
	glu::RenderContext&		renderCtx	= m_context.getRenderContext();

	ConstantShaderGenerator	sourceGen	(m_rnd);

	ShaderAllocator			shaders		(renderCtx, sourceGen);
	glu::Program			program		(renderCtx);

	buildProgram(program, shaders);

	if (program.getLinkStatus())
	{
		ProgramBinary binary;
		getProgramBinary(binary, program.getProgram());

		executeForProgram(program, shaders);

		verify(program, binary);

		logProgram(log, renderCtx, program, shaders);
	}
	else
	{
		log << TestLog::Message << "Fail, couldn't link program." << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Linking failed");
	}
}